

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

int sx_vsnprintf(char *str,int size,char *fmt,__va_list_tag *args)

{
  uint uVar1;
  char *buf;
  stbsp__context *c_1;
  char *pcVar2;
  stbsp__context c;
  char *local_228;
  uint local_220;
  char local_21c [516];
  
  if (str == (char *)0x0 && size == 0) {
    local_220 = 0;
    stbsp_vsprintfcb(stbsp__count_clamp_callback,&local_228,local_21c,fmt,args);
  }
  else if (size == 0) {
    local_220 = 0;
  }
  else {
    uVar1 = size >> 0x1f & size;
    local_228 = str;
    local_220 = size;
    if (uVar1 != 0) {
      local_228 = (char *)(long)(int)uVar1;
      local_220 = size - uVar1;
    }
    pcVar2 = local_21c;
    if (0x1ff < local_220) {
      pcVar2 = local_228;
    }
    buf = (char *)0x0;
    if (0 < (int)local_220) {
      buf = pcVar2;
    }
    stbsp_vsprintfcb(stbsp__clamp_callback,&local_228,buf,fmt,args);
    local_228._0_4_ = (int)local_228 - (int)str;
    local_220 = size + -1;
    if ((int)local_228 < size) {
      local_220 = (int)local_228;
    }
    str[(int)local_220] = '\0';
  }
  return local_220;
}

Assistant:

int sx_vsnprintf(char* str, int size, const char* fmt, va_list args)
{
    return stbsp_vsnprintf(str, size, fmt, args);
}